

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayGenericFold<double,duckdb::NegativeInnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  BoundFunctionExpression *pBVar5;
  reference pvVar6;
  Vector *vector;
  Vector *vector_00;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  InvalidInputException *pIVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  bool bVar17;
  double dVar18;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  string local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(args + 0x18);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar6);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar6);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,(UnifiedVectorFormat *)pbVar1);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,(UnifiedVectorFormat *)pbVar1);
  lVar2 = *(long *)(vector + 0x20);
  lVar3 = *(long *)(vector_00 + 0x20);
  lVar4 = *(long *)(result + 0x20);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  lVar7 = duckdb::ArrayType::GetSize((LogicalType *)(pvVar6 + 8));
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar8 = pbVar13;
      if (*local_78[0] != 0) {
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)*(uint *)(*local_78[0] + (long)pbVar13 * 4);
      }
      pbVar11 = pbVar13;
      if (*local_c0[0] != 0) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_c0[0] + (long)pbVar13 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + ((ulong)pbVar8 >> 6) * 8) >> ((ulong)pbVar8 & 0x3f) & 1) != 0)) &&
         ((local_b0 == 0 ||
          ((*(ulong *)(local_b0 + ((ulong)pbVar11 >> 6) * 8) >> ((ulong)pbVar11 & 0x3f) & 1) != 0)))
         ) {
        uVar9 = (long)pbVar8 * lVar7;
        lVar12 = *(long *)(vector + 0x28);
        if (lVar12 != 0) {
          bVar17 = uVar9 + lVar7 <= uVar9;
          if ((!bVar17) &&
             (lVar14 = lVar7 + -1, uVar15 = uVar9,
             (*(ulong *)(lVar12 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0)) {
            do {
              uVar15 = uVar15 + 1;
              if (lVar14 == 0) break;
              lVar14 = lVar14 + -1;
            } while ((*(ulong *)(lVar12 + (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) != 0);
            bVar17 = uVar9 + lVar7 <= uVar15;
          }
          if (!bVar17) {
            pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_e0[0] = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"%s: left argument can not contain NULL values","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,*(long *)(pBVar5 + 0x60),
                       *(long *)(pBVar5 + 0x68) + *(long *)(pBVar5 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_e0,&local_100,pbVar11);
            duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_160);
            __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar11 * lVar7);
        lVar12 = *(long *)(vector_00 + 0x28);
        if (lVar12 != 0) {
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar11->_M_dataplus)._M_p + lVar7);
          bVar17 = pbVar8 <= pbVar11;
          if ((!bVar17) &&
             (lVar14 = lVar7 + -1, pbVar16 = pbVar11,
             (*(ulong *)(lVar12 + ((ulong)pbVar11 >> 6) * 8) >> ((ulong)pbVar11 & 0x3f) & 1) != 0))
          {
            do {
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar16->_M_dataplus)._M_p + 1);
              if (lVar14 == 0) break;
              lVar14 = lVar14 + -1;
            } while ((*(ulong *)(lVar12 + ((ulong)pbVar16 >> 6) * 8) >> ((ulong)pbVar16 & 0x3f) & 1)
                     != 0);
            bVar17 = pbVar8 <= pbVar16;
          }
          if (!bVar17) {
            pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_120[0] = local_110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"%s: right argument can not contain NULL values","");
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,*(long *)(pBVar5 + 0x60),
                       *(long *)(pBVar5 + 0x68) + *(long *)(pBVar5 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_120,&local_140,pbVar11);
            duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_160);
            __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        if (lVar7 == 0) {
          dVar18 = 0.0;
        }
        else {
          dVar18 = 0.0;
          lVar12 = 0;
          do {
            dVar18 = dVar18 + *(double *)(lVar2 + uVar9 * 8 + lVar12 * 8) *
                              *(double *)(lVar3 + (long)pbVar11 * 8 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar7 != lVar12);
        }
        *(double *)(lVar4 + (long)pbVar13 * 8) = -dVar18;
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pbVar13,true);
      }
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar13->_M_dataplus)._M_p + 1);
    } while (pbVar13 != pbVar1);
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}